

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *interfaceNode)

{
  ElementCount EVar1;
  ListElementCount LVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t uVar5;
  bool *__s;
  byte bVar6;
  ulong __n;
  ElementCount EVar7;
  bool bVar8;
  Reader method;
  Array<bool> sawCodeOrder_heap;
  bool _kjCondition;
  undefined1 auStack_14f [15];
  CapTableReader *pCStack_148;
  WirePointer *local_140;
  int local_138;
  Fault f;
  CapTableReader *local_128;
  Reader methods;
  anon_class_8_1_60e9c21f _kjContextFunc438;
  anon_class_8_1_6f242a07 local_c0;
  anon_class_16_2_3f8e8a0c local_b8;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:438:7)>
  _kjContext438;
  bool sawCodeOrder_stack [32];
  
  if ((interfaceNode->_reader).pointerCount < 5) {
    methods.reader.elementCount = 0x7fffffff;
    methods.reader.capTable = (CapTableReader *)0x0;
    methods.reader.ptr = (byte *)0x0;
    methods.reader.segment = (SegmentReader *)0x0;
  }
  else {
    methods.reader.segment = (interfaceNode->_reader).segment;
    methods.reader.capTable = (interfaceNode->_reader).capTable;
    methods.reader.ptr = (byte *)((interfaceNode->_reader).pointers + 4);
    methods.reader.elementCount = (interfaceNode->_reader).nestingLimit;
  }
  EVar7 = 0;
  _::PointerReader::getList
            ((ListReader *)&_kjContext438,(PointerReader *)&methods,INLINE_COMPOSITE,(word *)0x0);
  if (_kjContext438.super_Context.value.ptr._0_4_ != 0) {
    do {
      _::ListReader::getStructElement((StructReader *)&methods,(ListReader *)&_kjContext438,EVar7);
      if (methods.reader.structDataSize < 0x40) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(uint64_t *)methods.reader.ptr;
      }
      validateTypeId(this,uVar5,INTERFACE);
      local_128 = methods.reader.capTable;
      f.exception = (Exception *)methods.reader.segment;
      if (methods.reader.structPointerCount == 0) {
        local_128 = (CapTableReader *)0x0;
        f.exception = (Exception *)(SegmentReader *)0x0;
      }
      _::PointerReader::getStruct(&method._reader,(PointerReader *)&f,(word *)0x0);
      validate(this,(Reader *)&method._reader);
      EVar7 = EVar7 + 1;
    } while (_kjContext438.super_Context.value.ptr._0_4_ != EVar7);
  }
  if ((interfaceNode->_reader).pointerCount < 4) {
    _kjContext438.super_Context.value.ptr._0_4_ = 0x7fffffff;
    _kjContext438.super_Context.super_ExceptionCallback.next = (ExceptionCallback *)0x0;
    _kjContext438.super_Context._16_8_ = (WirePointer *)0x0;
    _kjContext438.super_Context.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)0x0;
  }
  else {
    _kjContext438.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
         (_func_int **)(interfaceNode->_reader).segment;
    _kjContext438.super_Context.super_ExceptionCallback.next =
         (ExceptionCallback *)(interfaceNode->_reader).capTable;
    _kjContext438.super_Context._16_8_ = (interfaceNode->_reader).pointers + 3;
    _kjContext438.super_Context.value.ptr._0_4_ = (interfaceNode->_reader).nestingLimit;
  }
  _::PointerReader::getList
            (&methods.reader,(PointerReader *)&_kjContext438,INLINE_COMPOSITE,(word *)0x0);
  LVar2 = methods.reader.elementCount;
  uVar3 = (ulong)methods.reader.elementCount;
  if (uVar3 < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
  }
  else {
    sawCodeOrder_heap.ptr =
         (bool *)kj::_::HeapArrayDisposer::allocateImpl
                           (1,uVar3,uVar3,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.size_ = uVar3;
  }
  __s = sawCodeOrder_heap.ptr;
  __n = sawCodeOrder_heap.size_;
  if (LVar2 < 0x21) {
    __s = sawCodeOrder_stack;
    __n = uVar3;
  }
  EVar7 = 0;
  memset(__s,0,__n);
  if (methods.reader.elementCount != 0) {
    EVar1 = methods.reader.elementCount - 1;
    do {
      _::ListReader::getStructElement(&method._reader,&methods.reader,EVar7);
      _kjContextFunc438.method = (Reader *)&method._reader;
      kj::_::Debug::Context::Context(&_kjContext438.super_Context);
      _kjContext438.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
           (_func_int **)&PTR__Context_001c2f78;
      _kjContext438.func = &_kjContextFunc438;
      local_128 = method._reader.capTable;
      f.exception = (Exception *)method._reader.segment;
      if (method._reader.pointerCount == 0) {
        local_128 = (CapTableReader *)0x0;
        f.exception = (Exception *)(SegmentReader *)0x0;
      }
      __kjCondition =
           (ArrayPtr<const_char>)
           _::PointerReader::getBlob<capnp::Text>((PointerReader *)&f,(void *)0x0,0);
      local_c0.update = &local_b8;
      _f = __kjCondition;
      local_b8.name = (StringPtr *)&_kjCondition;
      local_b8.this = this;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                ((Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                  *)&this->members,(Entry *)&f,&local_c0);
      uVar4 = 0;
      if (0xf < method._reader.dataSize) {
        uVar4 = (uint)*method._reader.data;
      }
      if (uVar4 < methods.reader.elementCount) {
        if (method._reader.dataSize < 0x10) {
          uVar3 = 0;
        }
        else {
          uVar3 = (ulong)*method._reader.data;
        }
        bVar6 = __s[uVar3] ^ 1;
      }
      else {
        bVar6 = 0;
      }
      _kjCondition = (bool)bVar6;
      if (bVar6 == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x1bb,FAILED,
                   "method.getCodeOrder() < methods.size() && !sawCodeOrder[method.getCodeOrder()]",
                   "_kjCondition,\"invalid codeOrder\"",&_kjCondition,
                   (char (*) [18])"invalid codeOrder");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
      }
      else {
        if (method._reader.dataSize < 0x10) {
          uVar3 = 0;
        }
        else {
          uVar3 = (ulong)*method._reader.data;
        }
        __s[uVar3] = true;
        if (method._reader.dataSize < 0x80) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(uint64_t *)((long)method._reader.data + 8);
        }
        validateTypeId(this,uVar5,STRUCT);
        if (method._reader.pointerCount < 3) {
          local_138 = 0x7fffffff;
          pCStack_148 = (CapTableReader *)0x0;
          local_140 = (WirePointer *)0x0;
          __kjCondition = (SegmentReader *)0x0;
        }
        else {
          local_140 = method._reader.pointers + 2;
          pCStack_148 = method._reader.capTable;
          __kjCondition = method._reader.segment;
          local_138 = method._reader.nestingLimit;
        }
        _::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&_kjCondition,(word *)0x0);
        validate(this,(Reader *)&f);
        if (method._reader.dataSize < 0xc0) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(uint64_t *)((long)method._reader.data + 0x10);
        }
        validateTypeId(this,uVar5,STRUCT);
        if (method._reader.pointerCount < 4) {
          local_138 = 0x7fffffff;
          pCStack_148 = (CapTableReader *)0x0;
          local_140 = (WirePointer *)0x0;
          __kjCondition = (SegmentReader *)0x0;
        }
        else {
          local_140 = method._reader.pointers + 3;
          pCStack_148 = method._reader.capTable;
          __kjCondition = method._reader.segment;
          local_138 = method._reader.nestingLimit;
        }
        _::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&_kjCondition,(word *)0x0);
        validate(this,(Reader *)&f);
      }
      kj::_::Debug::Context::~Context(&_kjContext438.super_Context);
      bVar8 = EVar1 != EVar7;
      EVar7 = EVar7 + 1;
    } while ((bVar6 & bVar8) != 0);
  }
  if (sawCodeOrder_heap.ptr != (bool *)0x0) {
    (*(code *)**(undefined8 **)sawCodeOrder_heap.disposer)
              (sawCodeOrder_heap.disposer,sawCodeOrder_heap.ptr,1,sawCodeOrder_heap.size_,
               sawCodeOrder_heap.size_,0);
  }
  return;
}

Assistant:

void validate(const schema::Node::Interface::Reader& interfaceNode) {
    for (auto extend: interfaceNode.getSuperclasses()) {
      validateTypeId(extend.getId(), schema::Node::INTERFACE);
      validate(extend.getBrand());
    }

    auto methods = interfaceNode.getMethods();
    KJ_STACK_ARRAY(bool, sawCodeOrder, methods.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto method: methods) {
      KJ_CONTEXT("validating method", method.getName());
      validateMemberName(method.getName(), index++);

      VALIDATE_SCHEMA(method.getCodeOrder() < methods.size() &&
                      !sawCodeOrder[method.getCodeOrder()],
                      "invalid codeOrder");
      sawCodeOrder[method.getCodeOrder()] = true;

      validateTypeId(method.getParamStructType(), schema::Node::STRUCT);
      validate(method.getParamBrand());
      validateTypeId(method.getResultStructType(), schema::Node::STRUCT);
      validate(method.getResultBrand());
    }
  }